

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

void AddNodeWeight(uint *iScene,aiNode *pcNode)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = *iScene;
  *iScene = uVar1 + 0x478;
  uVar1 = uVar1 + pcNode->mNumMeshes * 4 + 0x478;
  *iScene = uVar1;
  *iScene = uVar1 + pcNode->mNumChildren * 8;
  if (pcNode->mNumChildren != 0) {
    uVar2 = 0;
    do {
      AddNodeWeight(iScene,pcNode->mChildren[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < pcNode->mNumChildren);
  }
  return;
}

Assistant:

inline void AddNodeWeight(unsigned int& iScene,const aiNode* pcNode)
{
    iScene += sizeof(aiNode);
    iScene += sizeof(unsigned int) * pcNode->mNumMeshes;
    iScene += sizeof(void*) * pcNode->mNumChildren;

    for (unsigned int i = 0; i < pcNode->mNumChildren;++i) {
        AddNodeWeight(iScene,pcNode->mChildren[i]);
    }
}